

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

void create_game_windows(void)

{
  int iVar1;
  
  layout_game_windows();
  iVar1 = 3 - (uint)(ui_flags.status3 == '\0');
  werase(basewin);
  if (ui_flags.draw_frame == '\0') {
    msgwin = (WINDOW *)newwin(ui_flags.msgheight,0x50,0,0);
    mapwin = (WINDOW *)newwin(0x15,0x50,ui_flags.msgheight,0);
    statuswin = (WINDOW *)derwin(basewin,iVar1,0x50,ui_flags.msgheight + 0x15,0);
    if (ui_flags.draw_sidebar != '\0') {
      sidebar = (WINDOW *)derwin(basewin,ui_flags.viewheight,_COLS + -0x50,0,0x50);
    }
  }
  else {
    msgwin = (WINDOW *)newwin(ui_flags.msgheight,0x50,1,1);
    mapwin = (WINDOW *)newwin(0x15,0x50,ui_flags.msgheight + 2,1);
    statuswin = (WINDOW *)derwin(basewin,iVar1,0x50,ui_flags.msgheight + 0x18,1);
    if (ui_flags.draw_sidebar != '\0') {
      sidebar = (WINDOW *)derwin(basewin,ui_flags.viewheight,_COLS + -0x53,1,0x52);
    }
    draw_frame();
  }
  keypad(mapwin,1);
  keypad(msgwin,1);
  leaveok(mapwin,0);
  leaveok(msgwin,0);
  leaveok(statuswin,1);
  if (sidebar != (WINDOW *)0x0) {
    leaveok(sidebar,1);
  }
  ui_flags.ingame = '\x01';
  redraw_game_windows();
  return;
}

Assistant:

void create_game_windows(void)
{
    int statusheight;

    layout_game_windows();
    statusheight = ui_flags.status3 ? 3 : 2;
    
    werase(basewin);
    if (ui_flags.draw_frame) {
	msgwin = newwin(ui_flags.msgheight, COLNO, 1, 1);
	mapwin = newwin(ROWNO, COLNO, ui_flags.msgheight + 2, 1);
	statuswin = derwin(basewin, statusheight, COLNO,
			   ui_flags.msgheight + ROWNO + 3, 1);
	
	if (ui_flags.draw_sidebar)
	    sidebar = derwin(basewin, ui_flags.viewheight, COLS - COLNO - 3, 1, COLNO+2);
	
	draw_frame();
    } else {
	msgwin = newwin(ui_flags.msgheight, COLNO, 0, 0);
	mapwin = newwin(ROWNO, COLNO, ui_flags.msgheight, 0);
	statuswin = derwin(basewin, statusheight, COLNO, ui_flags.msgheight + ROWNO, 0);
	
	if (ui_flags.draw_sidebar)
	    sidebar = derwin(basewin, ui_flags.viewheight, COLS - COLNO, 0, COLNO);
    }
    
    keypad(mapwin, TRUE);
    keypad(msgwin, TRUE);
    leaveok(mapwin, FALSE);
    leaveok(msgwin, FALSE);
    leaveok(statuswin, TRUE);
    if (sidebar)
	leaveok(sidebar, TRUE);
    
    ui_flags.ingame = TRUE;
    redraw_game_windows();
}